

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

void __thiscall
spirv_cross::SmallVector<unsigned_int,_8UL>::resize
          (SmallVector<unsigned_int,_8UL> *this,size_t new_size)

{
  uint *puVar1;
  ulong uVar2;
  
  if ((this->super_VectorView<unsigned_int>).buffer_size < new_size) {
    reserve(this,new_size);
    puVar1 = (this->super_VectorView<unsigned_int>).ptr;
    for (uVar2 = (this->super_VectorView<unsigned_int>).buffer_size; uVar2 < new_size;
        uVar2 = uVar2 + 1) {
      puVar1[uVar2] = 0;
    }
  }
  (this->super_VectorView<unsigned_int>).buffer_size = new_size;
  return;
}

Assistant:

void resize(size_t new_size) SPIRV_CROSS_NOEXCEPT
	{
		if (new_size < this->buffer_size)
		{
			for (size_t i = new_size; i < this->buffer_size; i++)
				this->ptr[i].~T();
		}
		else if (new_size > this->buffer_size)
		{
			reserve(new_size);
			for (size_t i = this->buffer_size; i < new_size; i++)
				new (&this->ptr[i]) T();
		}

		this->buffer_size = new_size;
	}